

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Initiate.cpp
# Opt level: O3

object get_digest(SRUP_MSG_INIT *self)

{
  char *__s;
  size_t sVar1;
  PyObject *pPVar2;
  SRUP_MSG_INIT *in_RSI;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  __s = SRUP_MSG_INIT::digest(in_RSI);
  if (__s == (char *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)&_Py_NoneStruct;
  }
  else {
    local_40[0] = local_30;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,__s + sVar1);
    pPVar2 = boost::python::api::object_initializer_impl<false,false>::get<std::__cxx11::string>
                       ((string *)local_40);
    (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)pPVar2;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_digest(SRUP_MSG_INIT& self)
{
    const char* rv;
    rv = self.digest();

    if (rv != nullptr)
        return boost::python::object(std::string(rv));
    else
        return boost::python::object();
}